

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O0

bool __thiscall duckdb::hugeint_t::operator!(hugeint_t *this)

{
  bool bVar1;
  hugeint_t *in_RDI;
  hugeint_t *unaff_retaddr;
  int64_t in_stack_ffffffffffffffe8;
  hugeint_t *in_stack_fffffffffffffff0;
  
  hugeint_t(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  bVar1 = operator==(unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

bool hugeint_t::operator!() const {
	return *this == 0;
}